

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall
t_py_generator::generate_deserialize_struct
          (t_py_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  t_struct *ptVar1;
  bool bVar2;
  ostream *poVar3;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_py_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  bVar2 = is_immutable(&tstruct->super_t_type);
  ptVar1 = tstruct_local;
  if (bVar2) {
    t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_48);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3," = ");
    type_name_abi_cxx11_(&local_78,this,(t_type *)prefix_local);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    poVar3 = std::operator<<(poVar3,".read(iprot)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_98);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3," = ");
    type_name_abi_cxx11_(&local_b8,this,(t_type *)prefix_local);
    poVar3 = std::operator<<(poVar3,(string *)&local_b8);
    poVar3 = std::operator<<(poVar3,"()");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,".read(iprot)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void t_py_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  if (is_immutable(tstruct)) {
    out << indent() << prefix << " = " << type_name(tstruct) << ".read(iprot)" << endl;
  } else {
    out << indent() << prefix << " = " << type_name(tstruct) << "()" << endl
        << indent() << prefix << ".read(iprot)" << endl;
  }
}